

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall
Js::PolymorphicInlineCache::CopyTo
          (PolymorphicInlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,
          PolymorphicInlineCache *clone)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type pIVar4;
  ulong uVar5;
  long lVar6;
  uint inlineCacheIndex;
  ulong uVar7;
  Type *type;
  
  if (clone == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x36d,"(clone)","clone");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
  clone->cloneForJitTimeUse = this->cloneForJitTimeUse;
  if (this->size != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pIVar4 = this->inlineCaches;
      if ((*(byte *)((long)&pIVar4->u + lVar6 + 0x10) & 1) == 0) {
        if ((*(byte *)((long)&pIVar4->u + lVar6) & 1) == 0) {
          if ((*(byte *)((long)&pIVar4->u + lVar6 + 8) & 1) == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)((long)&pIVar4->u + lVar6 + 0x10);
          }
        }
        else {
          uVar7 = *(ulong *)((long)&pIVar4->u + lVar6 + 8);
        }
      }
      else {
        uVar7 = *(ulong *)((long)&pIVar4->u + lVar6);
      }
      type = (Type *)(uVar7 & 0xfffffffffffffffb);
      if (type != (Type *)0x0) {
        uVar7 = (ulong)clone->size + 0xffffffff & uVar7 >> 6;
        bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,CloneCacheInCollisionPhase);
        inlineCacheIndex = (uint)uVar7;
        if (!bVar2) {
          if (clone->inlineCaches[uVar7 & 0xffffffff].u.local.type != (Type *)0x0) {
            pIVar4 = clone->inlineCaches + (uVar7 & 0xffffffff);
            if (((((undefined1  [24])((undefined1  [24])pIVar4->u & (undefined1  [24])0x1) ==
                   (undefined1  [24])0x0) || ((pIVar4->u).local.typeWithoutProperty == (Type *)0x0))
                && ((~*(uint *)((long)&pIVar4->u + 8) & 0xd) != 0)) && (this->size != 1)) {
              if ((undefined1  [24])((undefined1  [24])pIVar4->u & (undefined1  [24])0x1) ==
                  (undefined1  [24])0x0) {
                if ((undefined1  [24])((undefined1  [24])pIVar4->u & (undefined1  [24])0x1) ==
                    (undefined1  [24])0x0) {
                  CloneInlineCacheToEmptySlotInCollision<false,false,true>
                            (clone,type,inlineCacheIndex);
                }
                else {
                  CloneInlineCacheToEmptySlotInCollision<false,true,false>
                            (clone,type,inlineCacheIndex);
                }
              }
              else {
                CloneInlineCacheToEmptySlotInCollision<true,false,false>
                          (clone,type,inlineCacheIndex);
              }
            }
          }
        }
        InlineCache::CopyTo((InlineCache *)((long)&this->inlineCaches->u + lVar6),propertyId,
                            scriptContext,clone->inlineCaches + (uVar7 & 0xffffffff));
        UpdateInlineCachesFillInfo(clone,inlineCacheIndex,true);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < this->size);
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CopyTo(PropertyId propertyId, ScriptContext* scriptContext, PolymorphicInlineCache *const clone)
    {
        Assert(clone);

        clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
        clone->cloneForJitTimeUse = this->cloneForJitTimeUse;

        for (uint i = 0; i < GetSize(); ++i)
        {
            Type * type = inlineCaches[i].GetType();
            if (type)
            {
                uint inlineCacheIndex = clone->GetInlineCacheIndexForType(type);

                // When copying inline caches from one polymorphic cache to another, types are again hashed to get the corresponding indices in the new polymorphic cache.
                // This might lead to collision in the new cache. We need to try to resolve that collision.
                if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
                {
                    if (!clone->inlineCaches[inlineCacheIndex].IsEmpty() && !clone->inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
                    {
                        if (clone->inlineCaches[inlineCacheIndex].IsLocal())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                        }
                        else if (clone->inlineCaches[inlineCacheIndex].IsProto())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                        }
                        else
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                        }

                    }
                }
                inlineCaches[i].CopyTo(propertyId, scriptContext, &clone->inlineCaches[inlineCacheIndex]);
                clone->UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);
            }
        }
    }